

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O0

int __thiscall zmq::tcp_connecter_t::open(tcp_connecter_t *this,char *__file,int __oflag,...)

{
  bool bVar1;
  fd_t fVar2;
  socklen_t sVar3;
  void *pvVar4;
  char *pcVar5;
  sockaddr *psVar6;
  int *piVar7;
  char *errstr;
  int flag;
  int rc;
  tcp_address_t *tcp_addr;
  undefined4 in_stack_ffffffffffffff70;
  fd_t in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  undefined2 uVar8;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  void *local_60;
  undefined4 local_40;
  int local_3c;
  tcp_address_t *local_38;
  undefined1 local_19;
  void *local_18;
  tcp_connecter_t *local_10;
  int local_4;
  
  uVar8 = (undefined2)((ulong)in_stack_ffffffffffffff78 >> 0x30);
  local_10 = this;
  if ((this->super_stream_connecter_base_t)._s != -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s == retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
            ,0xb0);
    fflush(_stderr);
    zmq_abort((char *)0x23d5ba);
  }
  if ((((this->super_stream_connecter_base_t)._addr)->resolved).dummy != (void *)0x0) {
    pvVar4 = (((this->super_stream_connecter_base_t)._addr)->resolved).dummy;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,0x3c);
    }
    (((this->super_stream_connecter_base_t)._addr)->resolved).dummy = (void *)0x0;
  }
  pvVar4 = operator_new(0x3c,(nothrow_t *)&std::nothrow);
  local_19 = 0;
  local_60 = (void *)0x0;
  if (pvVar4 != (void *)0x0) {
    local_19 = 1;
    local_18 = pvVar4;
    tcp_address_t::tcp_address_t
              ((tcp_address_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_60 = pvVar4;
  }
  (((this->super_stream_connecter_base_t)._addr)->resolved).dummy = local_60;
  if ((((this->super_stream_connecter_base_t)._addr)->resolved).dummy == (void *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
            ,0xb8);
    fflush(_stderr);
    zmq_abort((char *)0x23d6cd);
  }
  std::__cxx11::string::c_str();
  fVar2 = tcp_open_socket(in_stack_ffffffffffffff88,
                          (options_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                          ,SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0),
                          (tcp_address_t *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  (this->super_stream_connecter_base_t)._s = fVar2;
  if ((this->super_stream_connecter_base_t)._s == -1) {
    pvVar4 = (((this->super_stream_connecter_base_t)._addr)->resolved).dummy;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,0x3c);
    }
    (((this->super_stream_connecter_base_t)._addr)->resolved).dummy = (void *)0x0;
    local_4 = -1;
  }
  else {
    if ((((this->super_stream_connecter_base_t)._addr)->resolved).dummy == (void *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_addr->resolved.tcp_addr != NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
              ,0xc1);
      fflush(_stderr);
      zmq_abort((char *)0x23d805);
    }
    unblock_socket(in_stack_ffffffffffffff74);
    local_38 = (((this->super_stream_connecter_base_t)._addr)->resolved).tcp_addr;
    bVar1 = tcp_address_t::has_src_addr(local_38);
    if (bVar1) {
      local_40 = 1;
      local_3c = setsockopt((this->super_stream_connecter_base_t)._s,1,2,&local_40,4);
      if (local_3c != 0) {
        piVar7 = __errno_location();
        pcVar5 = strerror(*piVar7);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
                ,0xd9);
        fflush(_stderr);
        zmq_abort((char *)0x23d8d4);
      }
      fVar2 = (this->super_stream_connecter_base_t)._s;
      psVar6 = tcp_address_t::src_addr((tcp_address_t *)0x23d8ef);
      sVar3 = tcp_address_t::src_addrlen((tcp_address_t *)0x23d8fe);
      local_3c = bind(fVar2,(sockaddr *)psVar6,sVar3);
      if (local_3c == -1) {
        return -1;
      }
    }
    fVar2 = (this->super_stream_connecter_base_t)._s;
    psVar6 = tcp_address_t::addr((tcp_address_t *)0x23d941);
    sVar3 = tcp_address_t::addrlen((tcp_address_t *)0x23d950);
    local_3c = ::connect(fVar2,(sockaddr *)psVar6,sVar3);
    if (local_3c == 0) {
      local_4 = 0;
    }
    else {
      piVar7 = __errno_location();
      if (*piVar7 == 4) {
        piVar7 = __errno_location();
        *piVar7 = 0x73;
      }
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int zmq::tcp_connecter_t::open ()
{
    zmq_assert (_s == retired_fd);

    //  Resolve the address
    if (_addr->resolved.tcp_addr != NULL) {
        LIBZMQ_DELETE (_addr->resolved.tcp_addr);
    }

    _addr->resolved.tcp_addr = new (std::nothrow) tcp_address_t ();
    alloc_assert (_addr->resolved.tcp_addr);
    _s = tcp_open_socket (_addr->address.c_str (), options, false, true,
                          _addr->resolved.tcp_addr);
    if (_s == retired_fd) {
        //  TODO we should emit some event in this case!

        LIBZMQ_DELETE (_addr->resolved.tcp_addr);
        return -1;
    }
    zmq_assert (_addr->resolved.tcp_addr != NULL);

    // Set the socket to non-blocking mode so that we get async connect().
    unblock_socket (_s);

    const tcp_address_t *const tcp_addr = _addr->resolved.tcp_addr;

    int rc;

    // Set a source address for conversations
    if (tcp_addr->has_src_addr ()) {
        //  Allow reusing of the address, to connect to different servers
        //  using the same source port on the client.
        int flag = 1;
#ifdef ZMQ_HAVE_WINDOWS
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR,
                         reinterpret_cast<const char *> (&flag), sizeof (int));
        wsa_assert (rc != SOCKET_ERROR);
#elif defined ZMQ_HAVE_VXWORKS
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR, (char *) &flag,
                         sizeof (int));
        errno_assert (rc == 0);
#else
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR, &flag, sizeof (int));
        errno_assert (rc == 0);
#endif

#if defined ZMQ_HAVE_VXWORKS
        rc = ::bind (_s, (sockaddr *) tcp_addr->src_addr (),
                     tcp_addr->src_addrlen ());
#else
        rc = ::bind (_s, tcp_addr->src_addr (), tcp_addr->src_addrlen ());
#endif
        if (rc == -1)
            return -1;
    }

    //  Connect to the remote peer.
#if defined ZMQ_HAVE_VXWORKS
    rc = ::connect (_s, (sockaddr *) tcp_addr->addr (), tcp_addr->addrlen ());
#else
    rc = ::connect (_s, tcp_addr->addr (), tcp_addr->addrlen ());
#endif
    //  Connect was successful immediately.
    if (rc == 0) {
        return 0;
    }

    //  Translate error codes indicating asynchronous connect has been
    //  launched to a uniform EINPROGRESS.
#ifdef ZMQ_HAVE_WINDOWS
    const int last_error = WSAGetLastError ();
    if (last_error == WSAEINPROGRESS || last_error == WSAEWOULDBLOCK)
        errno = EINPROGRESS;
    else
        errno = wsa_error_to_errno (last_error);
#else
    if (errno == EINTR)
        errno = EINPROGRESS;
#endif
    return -1;
}